

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int LimitPayloadUb(ISACUBEncStruct *ISACencUB_obj,uint16_t payloadLimitBytes,
                  double bytesLeftSpecCoding,transcode_obj *transcodingParam,int16_t *fre,
                  int16_t *fim,double *lpcGains,ISACBand band,int status)

{
  double dStack_60;
  int16_t kAveragePitchGain;
  double transcodeScale;
  double bytesSpecCoderUsed;
  int k;
  int iterCntr;
  double *lpcGains_local;
  int16_t *fim_local;
  int16_t *fre_local;
  transcode_obj *transcodingParam_local;
  double bytesLeftSpecCoding_local;
  uint16_t payloadLimitBytes_local;
  ISACUBEncStruct *ISACencUB_obj_local;
  
  bytesSpecCoderUsed._4_4_ = 0;
  transcodingParam_local = (transcode_obj *)bytesLeftSpecCoding;
  while( true ) {
    if (4 < bytesSpecCoderUsed._4_4_) {
      return -0x1932;
    }
    if (status == -0x1928) {
      dStack_60 = ((double)transcodingParam_local / 600.0) * 0.5;
    }
    else {
      dStack_60 = (double)transcodingParam_local /
                  (double)((ISACencUB_obj->bitstr_obj).stream_index - transcodingParam->stream_index
                          );
    }
    dStack_60 = (1.0 - ((double)bytesSpecCoderUsed._4_4_ * 0.9) / 5.0) * dStack_60;
    if (band == kIsacUpperBand16) {
      for (bytesSpecCoderUsed._0_4_ = 0; bytesSpecCoderUsed._0_4_ < 6;
          bytesSpecCoderUsed._0_4_ = bytesSpecCoderUsed._0_4_ + 1) {
        transcodingParam->loFiltGain[bytesSpecCoderUsed._0_4_] =
             dStack_60 * transcodingParam->loFiltGain[bytesSpecCoderUsed._0_4_];
        transcodingParam->hiFiltGain[bytesSpecCoderUsed._0_4_] =
             dStack_60 * transcodingParam->hiFiltGain[bytesSpecCoderUsed._0_4_];
      }
    }
    else {
      for (bytesSpecCoderUsed._0_4_ = 0; bytesSpecCoderUsed._0_4_ < 6;
          bytesSpecCoderUsed._0_4_ = bytesSpecCoderUsed._0_4_ + 1) {
        transcodingParam->loFiltGain[bytesSpecCoderUsed._0_4_] =
             dStack_60 * transcodingParam->loFiltGain[bytesSpecCoderUsed._0_4_];
      }
    }
    for (bytesSpecCoderUsed._0_4_ = 0; bytesSpecCoderUsed._0_4_ < 0xf0;
        bytesSpecCoderUsed._0_4_ = bytesSpecCoderUsed._0_4_ + 1) {
      fre[bytesSpecCoderUsed._0_4_] =
           (int16_t)(int)((double)(int)fre[bytesSpecCoderUsed._0_4_] * dStack_60 + 0.5);
      fim[bytesSpecCoderUsed._0_4_] =
           (int16_t)(int)((double)(int)fim[bytesSpecCoderUsed._0_4_] * dStack_60 + 0.5);
    }
    memcpy((ISACencUB_obj->SaveEnc_obj).realFFT,fre,0x1e0);
    memcpy((ISACencUB_obj->SaveEnc_obj).imagFFT,fim,0x1e0);
    (ISACencUB_obj->bitstr_obj).W_upper = transcodingParam->W_upper;
    (ISACencUB_obj->bitstr_obj).stream_index = transcodingParam->stream_index;
    (ISACencUB_obj->bitstr_obj).streamval = transcodingParam->streamval;
    (ISACencUB_obj->bitstr_obj).stream[transcodingParam->stream_index - 2] =
         transcodingParam->stream[0];
    (ISACencUB_obj->bitstr_obj).stream[transcodingParam->stream_index - 1] =
         transcodingParam->stream[1];
    (ISACencUB_obj->bitstr_obj).stream[transcodingParam->stream_index] = transcodingParam->stream[2]
    ;
    memcpy((ISACencUB_obj->SaveEnc_obj).lpcGain,lpcGains,0x30);
    WebRtcIsac_EncodeLpcGainUb
              (transcodingParam->loFiltGain,&ISACencUB_obj->bitstr_obj,
               (ISACencUB_obj->SaveEnc_obj).lpcGainIndex);
    if (band == kIsacUpperBand16) {
      memcpy((ISACencUB_obj->SaveEnc_obj).lpcGain + 6,lpcGains + 6,0x30);
      WebRtcIsac_EncodeLpcGainUb
                (transcodingParam->hiFiltGain,&ISACencUB_obj->bitstr_obj,
                 (ISACencUB_obj->SaveEnc_obj).lpcGainIndex + 6);
    }
    transcodingParam_local =
         (transcode_obj *)
         (double)((uint)payloadLimitBytes - (ISACencUB_obj->bitstr_obj).stream_index);
    memcpy(&(ISACencUB_obj->SaveEnc_obj).bitStreamObj,ISACencUB_obj,0x264);
    status = WebRtcIsac_EncodeSpec(fre,fim,0,band,&ISACencUB_obj->bitstr_obj);
    if ((status < 0) && (status != -0x1928)) break;
    bytesSpecCoderUsed._4_4_ = bytesSpecCoderUsed._4_4_ + 1;
    if ((ISACencUB_obj->bitstr_obj).stream_index <= (uint)payloadLimitBytes && status != -0x1928) {
      return 0;
    }
  }
  return status;
}

Assistant:

static int LimitPayloadUb(ISACUBEncStruct* ISACencUB_obj,
                          uint16_t payloadLimitBytes,
                          double bytesLeftSpecCoding,
                          transcode_obj* transcodingParam,
                          int16_t* fre, int16_t* fim,
                          double* lpcGains, enum ISACBand band, int status) {

  int iterCntr = 0;
  int k;
  double bytesSpecCoderUsed;
  double transcodeScale;
  const int16_t kAveragePitchGain = 0.0;

  do {
    if (iterCntr >= MAX_PAYLOAD_LIMIT_ITERATION) {
      /* We were not able to limit the payload size. */
      return -ISAC_PAYLOAD_LARGER_THAN_LIMIT;
    }

    if (status == -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
      bytesSpecCoderUsed = STREAM_SIZE_MAX;
      /* Being conservative. */
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed * 0.5;
    } else {
      bytesSpecCoderUsed = ISACencUB_obj->bitstr_obj.stream_index -
          transcodingParam->stream_index;
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed;
    }

    /* To be safe, we reduce the scale depending on the
       number of iterations. */
    transcodeScale *= (1.0 - (0.9 * (double)iterCntr /
        (double)MAX_PAYLOAD_LIMIT_ITERATION));

    /* Scale the LPC Gains. */
    if (band == kIsacUpperBand16) {
      /* Two sets of coefficients if 16 kHz. */
      for (k = 0; k < SUBFRAMES; k++) {
        transcodingParam->loFiltGain[k] *= transcodeScale;
        transcodingParam->hiFiltGain[k] *= transcodeScale;
      }
    } else {
      /* One sets of coefficients if 12 kHz. */
      for (k = 0; k < SUBFRAMES; k++) {
        transcodingParam->loFiltGain[k] *= transcodeScale;
      }
    }

    /* Scale DFT coefficients. */
    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      fre[k] = (int16_t)(fre[k] * transcodeScale + 0.5);
      fim[k] = (int16_t)(fim[k] * transcodeScale + 0.5);
    }
    /* Store FFT coefficients for multiple encoding. */
    memcpy(ISACencUB_obj->SaveEnc_obj.realFFT, fre,
          sizeof(ISACencUB_obj->SaveEnc_obj.realFFT));
    memcpy(ISACencUB_obj->SaveEnc_obj.imagFFT, fim,
           sizeof(ISACencUB_obj->SaveEnc_obj.imagFFT));

    /* Store the state of arithmetic coder before coding LPC gains */
    ISACencUB_obj->bitstr_obj.W_upper = transcodingParam->W_upper;
    ISACencUB_obj->bitstr_obj.stream_index = transcodingParam->stream_index;
    ISACencUB_obj->bitstr_obj.streamval = transcodingParam->streamval;
    ISACencUB_obj->bitstr_obj.stream[transcodingParam->stream_index - 2] =
        transcodingParam->stream[0];
    ISACencUB_obj->bitstr_obj.stream[transcodingParam->stream_index - 1] =
        transcodingParam->stream[1];
    ISACencUB_obj->bitstr_obj.stream[transcodingParam->stream_index] =
        transcodingParam->stream[2];

    /* Store the gains for multiple encoding. */
    memcpy(ISACencUB_obj->SaveEnc_obj.lpcGain, lpcGains,
           SUBFRAMES * sizeof(double));
    /* Entropy Code lpc-gains, indices are stored for a later use.*/
    WebRtcIsac_EncodeLpcGainUb(transcodingParam->loFiltGain,
                               &ISACencUB_obj->bitstr_obj,
                               ISACencUB_obj->SaveEnc_obj.lpcGainIndex);

    /* If 16kHz should do one more set. */
    if (band == kIsacUpperBand16) {
      /* Store the gains for multiple encoding. */
      memcpy(&ISACencUB_obj->SaveEnc_obj.lpcGain[SUBFRAMES],
             &lpcGains[SUBFRAMES], SUBFRAMES * sizeof(double));
      /* Entropy Code lpc-gains, indices are stored for a later use.*/
      WebRtcIsac_EncodeLpcGainUb(
          transcodingParam->hiFiltGain, &ISACencUB_obj->bitstr_obj,
          &ISACencUB_obj->SaveEnc_obj.lpcGainIndex[SUBFRAMES]);
    }

    /* Update the number of bytes left for encoding the spectrum. */
    bytesLeftSpecCoding = payloadLimitBytes -
        ISACencUB_obj->bitstr_obj.stream_index;

    /* Save the bit-stream object at this point for FEC. */
    memcpy(&ISACencUB_obj->SaveEnc_obj.bitStreamObj,
           &ISACencUB_obj->bitstr_obj, sizeof(Bitstr));

    /* Encode the spectrum. */
    status = WebRtcIsac_EncodeSpec(fre, fim, kAveragePitchGain,
                                   band, &ISACencUB_obj->bitstr_obj);
    if ((status < 0) && (status != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
      /* There has been an error but it was not too large payload
         (we can cure too large payload). */
      return status;
    }
    iterCntr++;
  } while ((ISACencUB_obj->bitstr_obj.stream_index > payloadLimitBytes) ||
      (status == -ISAC_DISALLOWED_BITSTREAM_LENGTH));
  return 0;
}